

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void write_data_crc(FILE *fp,DataCrc *crc)

{
  ulong uVar1;
  
  if (fp != (FILE *)0x0) {
    fprintf((FILE *)fp,"%08d,",(ulong)crc->len);
    if (crc->sum_cnt != 0) {
      uVar1 = 0;
      do {
        fprintf((FILE *)fp," %lx,",crc->sum[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < crc->sum_cnt);
    }
    fprintf((FILE *)fp," %08x\n",(ulong)crc->vor);
    fflush((FILE *)fp);
    return;
  }
  return;
}

Assistant:

void write_data_crc(FILE *fp, DataCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        fprintf(fp, "%08d,", crc->len);
        for (loop = 0; loop < crc->sum_cnt; loop++) {
            fprintf(fp, " %lx,", crc->sum[loop]);
        }
        fprintf(fp, " %08x\n", crc->vor);
        fflush(fp);
    }
}